

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O2

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
setVertexName(Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,string *newName,int index)

{
  GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pGVar1;
  string asStack_38 [32];
  
  if ((-1 < index) && (index < this->vertexCount)) {
    pGVar1 = this->vertexList;
    std::__cxx11::string::string(asStack_38,(string *)newName);
    std::__cxx11::string::_M_assign((string *)&pGVar1[(uint)index].name);
    std::__cxx11::string::~string(asStack_38);
  }
  return;
}

Assistant:

void Graph<T>::setVertexName(std::string newName, int index)
{
  //set the name for the vertex at the passed index if the index is valid
  if(index >= 0 && index < vertexCount)
  {
    vertexList[index].setName(newName);
  }
}